

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O3

void __thiscall juzzlin::SimpleLogger::Impl::~Impl(Impl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  flush(this);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_message);
  std::ios_base::~ios_base((ios_base *)&this->field_0xa0);
  pcVar2 = (this->m_tag)._M_dataplus._M_p;
  paVar1 = &(this->m_tag).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this->m_lock)._M_device);
  return;
}

Assistant:

SimpleLogger::Impl::~Impl()
{
    flush();
}